

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfunc.h
# Opt level: O2

bool rapidjson::internal::CountStringCodePoint<rapidjson::UTF8<char>>
               (Ch *s,SizeType length,SizeType *outCount)

{
  uint __line;
  Ch *pCVar1;
  bool bVar2;
  SizeType SVar3;
  char *__assertion;
  uint codepoint;
  GenericStringStream<rapidjson::UTF8<char>_> is;
  
  if (s == (Ch *)0x0) {
    __assertion = "s != 0";
    __line = 0x41;
  }
  else {
    if (outCount != (SizeType *)0x0) {
      SVar3 = 0;
      is.src_ = s;
      is.head_ = s;
      do {
        pCVar1 = is.src_;
        if (s + length <= is.src_) {
          *outCount = SVar3;
          break;
        }
        bVar2 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                          (&is,&codepoint);
        SVar3 = SVar3 + 1;
      } while (bVar2);
      return s + length <= pCVar1;
    }
    __assertion = "outCount != 0";
    __line = 0x42;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/strfunc.h"
                ,__line,
                "bool rapidjson::internal::CountStringCodePoint(const typename Encoding::Ch *, SizeType, SizeType *) [Encoding = rapidjson::UTF8<>]"
               );
}

Assistant:

bool CountStringCodePoint(const typename Encoding::Ch* s, SizeType length, SizeType* outCount) {
    RAPIDJSON_ASSERT(s != 0);
    RAPIDJSON_ASSERT(outCount != 0);
    GenericStringStream<Encoding> is(s);
    const typename Encoding::Ch* end = s + length;
    SizeType count = 0;
    while (is.src_ < end) {
        unsigned codepoint;
        if (!Encoding::Decode(is, &codepoint))
            return false;
        count++;
    }
    *outCount = count;
    return true;
}